

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O3

bool __thiscall czh::node::Node::get<bool>(Node *this,source_location *l)

{
  __index_type _Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  int iVar5;
  variant_alternative_t<1UL,_variant<NodeData,_Value>_> *pvVar6;
  Node *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  undefined8 uVar9;
  undefined1 local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  assert_value(this,l);
  pvVar6 = std::get<1ul,czh::node::Node::NodeData,czh::value::Value>(&this->data);
  _Var1 = *(__index_type *)
           ((long)&(pvVar6->value).
                   super__Variant_base<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .
                   super__Move_assign_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                   .
                   super__Copy_assign_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                   .
                   super__Move_ctor_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                   .
                   super__Copy_ctor_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                   .
                   super__Variant_storage_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
           + 0x20);
  if (_Var1 == '\x04') goto LAB_001228f7;
  if (((_Var1 == '\x06') && (_strcasecmp != "N3czh5value9ReferenceE")) &&
     ((*_strcasecmp == '*' || (iVar5 = strcmp(_strcasecmp,"N3czh5value9ReferenceE"), iVar5 != 0))))
  {
    local_d0._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_0019c638;
    value::Value::internal_get<czh::value::Reference>((Reference *)local_f0,pvVar6);
    this_00 = get_end_of_list_of_ref(this,(Reference *)local_f0,l);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_f0);
    local_f0._0_8_ = (pointer)(local_f0 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f0,"Can not get a circular reference.","");
    if (this_00 == (Node *)0x0) {
      report_error((string *)local_f0,&this->czh_token,l);
    }
    if ((pointer)local_f0._0_8_ != (pointer)(local_f0 + 0x10)) {
      operator_delete((void *)local_f0._0_8_,(ulong)(local_f0._16_8_ + 1));
    }
    local_f0._0_8_ = &PTR_s__workspace_llm4binary_github_lic_0019c650;
    bVar4 = get<bool>(this_00,(source_location *)local_f0);
    return bVar4;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"std::string_view czh::value::details::nameof() [T = bool]","");
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_50,0,0,"The value is not \'",0x12);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar7->_M_dataplus)._M_p;
  paVar8 = &pbVar7->field_2;
  if (paVar2 == paVar8) {
    local_70.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_70.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_70._M_dataplus._M_p = (pointer)paVar2;
  }
  local_70._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_70,"\'.[Actual T = \'");
  paVar2 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
  paVar8 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == paVar8) {
    local_b0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    local_b0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_b0._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  value::details::get_typename_abi_cxx11_
            (&local_90,
             (details *)
             (long)(char)*(__index_type *)
                          ((long)&(pvVar6->value).
                                  super__Variant_base<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  .
                                  super__Move_assign_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                                  .
                                  super__Copy_assign_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                                  .
                                  super__Move_ctor_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                                  .
                                  super__Copy_ctor_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                                  .
                                  super__Variant_storage_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                          + 0x20),local_b0._M_string_length);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    uVar9 = local_b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_90._M_string_length + local_b0._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar9 = local_90.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_90._M_string_length + local_b0._M_string_length) goto LAB_00122784;
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_90,0,0,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  }
  else {
LAB_00122784:
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_b0,local_90._M_dataplus._M_p,local_90._M_string_length);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar7->_M_dataplus)._M_p;
  paVar8 = &pbVar7->field_2;
  if (paVar3 == paVar8) {
    local_d0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_d0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_d0._M_dataplus._M_p = (pointer)paVar3;
  }
  local_d0._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar7->_M_string_length = 0;
  paVar8->_M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_d0,"\'].");
  local_f0._0_8_ = (pbVar7->_M_dataplus)._M_p;
  paVar8 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._0_8_ == paVar8) {
    local_f0._16_8_ = paVar8->_M_allocated_capacity;
    local_f0._24_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    local_f0._0_8_ = (pointer)(local_f0 + 0x10);
  }
  else {
    local_f0._16_8_ = paVar8->_M_allocated_capacity;
  }
  local_f0._8_8_ = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  report_error((string *)local_f0,&this->czh_token,l);
  if ((pointer)local_f0._0_8_ != (pointer)(local_f0 + 0x10)) {
    operator_delete((void *)local_f0._0_8_,(ulong)(local_f0._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
LAB_001228f7:
  local_f0._0_8_ = &PTR_s__workspace_llm4binary_github_lic_0019c668;
  bVar4 = value::Value::internal_get<bool>(pvVar6);
  return bVar4;
}

Assistant:

T get(const std::source_location &l =
    std::source_location::current()) const
    {
      assert_value(l);
      auto &value = std::get<Value>(data);
      if (value.is<value::Reference>() && typeid(T) != typeid(value::Reference))
      {
        auto ptr = get_end_of_list_of_ref(value.get<value::Reference>(), l);
        assert_true(ptr != nullptr, "Can not get a circular reference.", czh_token, l);
        return ptr->get<T>();
      }
  
      if (!value.can_get<T>())
      {
        report_error("The value is not '" + std::string(value::details::nameof<T>()) + "'.[Actual T = '"
                     + value.get_typename() + "'].", czh_token, l);
      }
      return value.get<T>();
    }